

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseCatchExprList(WastParser *this,CatchVector *catches)

{
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  bool bVar4;
  Token token;
  Catch catch_;
  
  bVar4 = false;
  do {
    GetLocation(&token.loc,this);
    Catch::Catch(&catch_,&token.loc);
    Consume(&token,this);
    if (token.token_type_ == Catch) {
      RVar2 = ParseVar(this,&catch_.var);
      if (RVar2.enum_ != Error) {
LAB_0015a98b:
        RVar2 = ParseTerminatingInstrList(this,&catch_.exprs);
        if ((RVar2.enum_ != Error) && (RVar2 = Expect(this,Rpar), RVar2.enum_ != Error)) {
          std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                    (catches,&catch_);
          bVar1 = true;
          goto LAB_0015a9b3;
        }
      }
      bVar1 = false;
    }
    else {
      bVar1 = !bVar4;
      bVar4 = true;
      if (bVar1) goto LAB_0015a98b;
      bVar1 = false;
      Error(this,0x19f6fa);
      bVar4 = true;
    }
LAB_0015a9b3:
    Catch::~Catch(&catch_);
    if (!bVar1) {
      return (Result)Error;
    }
    bVar1 = Match(this,Lpar);
    if (!bVar1) {
      return (Result)Ok;
    }
    TVar3 = Peek(this,0);
    if ((TVar3 & ~After) != Catch) {
      return (Result)Ok;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCatchExprList(CatchVector* catches) {
  WABT_TRACE(ParseCatchExprList);
  bool parsedCatchAll = false;

  do {
    Catch catch_(GetLocation());

    auto token = Consume();
    if (token.token_type() == TokenType::Catch) {
      CHECK_RESULT(ParseVar(&catch_.var));
    } else {
      if (parsedCatchAll) {
        Error(token.loc, "multiple catch_all clauses not allowed");
        return Result::Error;
      }
      parsedCatchAll = true;
    }

    CHECK_RESULT(ParseTerminatingInstrList(&catch_.exprs));
    EXPECT(Rpar);
    catches->push_back(std::move(catch_));
  } while (Match(TokenType::Lpar) && IsCatch(Peek()));

  return Result::Ok;
}